

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  IConfig *pIVar1;
  StringRef text;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XmlWriter *this_00;
  StringRef name;
  undefined1 local_48 [32];
  ReusableStringStream local_28;
  
  pIVar1 = (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config;
  ReusableStringStream::ReusableStringStream(&local_28);
  iVar2 = (*pIVar1->_vptr_IConfig[0xd])(pIVar1);
  if (*(long *)CONCAT44(extraout_var,iVar2) != ((long *)CONCAT44(extraout_var,iVar2))[1]) {
    std::operator<<(local_28.m_oss,"filters=\'");
    iVar2 = (*pIVar1->_vptr_IConfig[0xd])(pIVar1);
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar2),local_28.m_oss);
    std::operator<<(local_28.m_oss,"\' ");
  }
  std::operator<<(local_28.m_oss,"rng-seed=");
  (*pIVar1->_vptr_IConfig[0x11])(pIVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_28.m_oss);
  std::__cxx11::stringbuf::str();
  this_00 = &this->xml;
  ReusableStringStream::~ReusableStringStream(&local_28);
  text._1_15_ = local_48._1_15_;
  text.m_start._0_1_ = local_48[0];
  XmlWriter::writeComment(this_00,text,Newline|Indent);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"testExecutions",(allocator<char> *)&local_28);
  XmlWriter::startElement(this_00,(string *)local_48,Newline|Indent);
  std::__cxx11::string::~string((string *)local_48);
  local_48[0] = (string)0x31;
  name.m_size = 7;
  name.m_start = "version";
  XmlWriter::writeAttribute<char,void>(this_00,name,local_48);
  return;
}

Assistant:

void SonarQubeReporter::testRunStarting(TestRunInfo const& testRunInfo) {
        CumulativeReporterBase::testRunStarting(testRunInfo);

        xml.writeComment( createMetadataString( *m_config ) );
        xml.startElement("testExecutions");
        xml.writeAttribute("version"_sr, '1');
    }